

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall CVmHandleManager::CVmHandleManager(CVmHandleManager *this)

{
  void **ppvVar1;
  ulong uVar2;
  
  this->_vptr_CVmHandleManager = (_func_int **)&PTR__CVmHandleManager_00362390;
  this->handles_max_ = 0x20;
  ppvVar1 = (void **)malloc(0x100);
  this->handles_ = ppvVar1;
  uVar2 = 0;
  do {
    this->handles_[uVar2] = (void *)0x0;
    uVar2 = uVar2 + 1;
  } while (uVar2 < this->handles_max_);
  return;
}

Assistant:

CVmHandleManager::CVmHandleManager()
{
    size_t i;

    /* allocate an initial array of handle slots */
    handles_max_ = 32;
    handles_ = (void **)t3malloc(handles_max_ * sizeof(*handles_));

    /* all slots are initially empty */
    for (i = 0 ; i < handles_max_ ; ++i)
        handles_[i] = 0;
}